

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_object.cc
# Opt level: O0

int write_str(BIO *bp,char *str)

{
  int iVar1;
  size_t sVar2;
  int local_2c;
  size_t len;
  char *str_local;
  BIO *bp_local;
  
  sVar2 = strlen(str);
  if (sVar2 < 0x80000000) {
    local_2c = (int)sVar2;
    iVar1 = BIO_write((BIO *)bp,str,local_2c);
    if (iVar1 != local_2c) {
      local_2c = -1;
    }
    bp_local._4_4_ = local_2c;
  }
  else {
    ERR_put_error(0xc,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_object.cc"
                  ,0x3b);
    bp_local._4_4_ = -1;
  }
  return bp_local._4_4_;
}

Assistant:

static int write_str(BIO *bp, const char *str) {
  size_t len = strlen(str);
  if (len > INT_MAX) {
    OPENSSL_PUT_ERROR(ASN1, ERR_R_OVERFLOW);
    return -1;
  }
  return BIO_write(bp, str, (int)len) == (int)len ? (int)len : -1;
}